

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix2 * matrix2_scalev2(matrix2 *self,vector2 *scale)

{
  matrix2 *pmVar1;
  undefined1 local_28 [8];
  matrix2 scalingMatrix;
  vector2 *scale_local;
  matrix2 *self_local;
  
  scalingMatrix.field_0.field_1.m22[1] = (float  [2])scale;
  pmVar1 = matrix2_make_transformation_scalingv2((matrix2 *)local_28,scale);
  pmVar1 = matrix2_multiply(self,pmVar1);
  return pmVar1;
}

Assistant:

HYPAPI struct matrix2 *matrix2_scalev2(struct matrix2 *self, const struct vector2 *scale)
{
	struct matrix2 scalingMatrix;

	return matrix2_multiply(self,
		matrix2_make_transformation_scalingv2(&scalingMatrix, scale));
}